

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec4 __thiscall
tcu::Texture2DArrayView::sample
          (Texture2DArrayView *this,Sampler *sampler,float s,float t,float r,float lod)

{
  WrapMode WVar1;
  undefined4 numLevels;
  IVec3 *in_RDX;
  Vec4 VVar2;
  
  numLevels = sampler->wrapR;
  WVar1 = sampler->wrapS;
  floorf(r + 0.5);
  VVar2 = sampleLevelArray2DOffset
                    ((ConstPixelBufferAccess *)this,numLevels,(Sampler *)(ulong)WVar1,s,t,lod,in_RDX
                    );
  return (Vec4)VVar2.m_data;
}

Assistant:

Vec4 Texture2DArrayView::sample (const Sampler& sampler, float s, float t, float r, float lod) const
{
	return sampleLevelArray2D(m_levels, m_numLevels, sampler, s, t, selectLayer(r), lod);
}